

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operators_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_29dc6::der_operators_power_e_Test::TestBody(der_operators_power_e_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_3;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_2;
  Message local_58;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_1;
  Message local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  der_operators_power_e_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  dVar3 = dnet::derivative::
          op_power<dnet::derivative::constant<(anonymous_namespace)::E>,_dnet::derivative::variant>
          ::f(1.0);
  dVar4 = std::exp(5.26354424712089e-315);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_20,"func::f(1.0f)","std::exp(1.0f)",(float)dVar3,SUB84(dVar4,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  dVar3 = dnet::derivative::
          op_power<dnet::derivative::constant<(anonymous_namespace)::E>,_dnet::derivative::variant>
          ::f(1.5);
  dVar4 = std::exp(5.28426686226704e-315);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_50,"func::f(1.5f)","std::exp(1.5f)",(float)dVar3,SUB84(dVar4,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  dVar3 = dnet::derivative::
          op_power<dnet::derivative::constant<(anonymous_namespace)::E>,_dnet::derivative::variant>
          ::d(1.5);
  dVar4 = std::exp(5.28426686226704e-315);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_70,"func::d(1.5f)","std::exp(1.5f)",(float)dVar3,SUB84(dVar4,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  dVar3 = dnet::derivative::
          op_power<dnet::derivative::constant<(anonymous_namespace)::E>,_dnet::derivative::variant>
          ::d(3.1414999961853027);
  dVar4 = std::exp(5.32864434252346e-315);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_90,"func::d(3.1415f)","std::exp(3.1415f)",(float)dVar3,SUB84(dVar4,0)
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  return;
}

Assistant:

TEST(der_operators, power_e)
    {
        // y = e^x
        // dy/dx = e^x
        typedef op_power<constant<E>, variant> func;
        EXPECT_FLOAT_EQ(func::f(1.0f), std::exp(1.0f));
        EXPECT_FLOAT_EQ(func::f(1.5f), std::exp(1.5f));
        EXPECT_FLOAT_EQ(func::d(1.5f), std::exp(1.5f));
        EXPECT_FLOAT_EQ(func::d(3.1415f), std::exp(3.1415f));
    }